

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_show_colormap.cxx
# Opt level: O0

int __thiscall ColorMenu::handle(ColorMenu *this,int e)

{
  int iVar1;
  int iVar2;
  int local_48;
  int local_44;
  int scr_h;
  int scr_w;
  int scr_y;
  int scr_x;
  int py;
  int px;
  int by;
  int bx;
  int Y;
  int X;
  Fl_Color c;
  int e_local;
  ColorMenu *this_local;
  
  Y = this->which;
  X = e;
  _c = this;
  switch(e) {
  case 1:
  case 5:
    iVar2 = Fl::event_x_root();
    iVar1 = Fl_Widget::x((Fl_Widget *)this);
    bx = (iVar2 - iVar1) + -4;
    if (-1 < bx) {
      bx = bx / 0xe;
    }
    iVar2 = Fl::event_y_root();
    iVar1 = Fl_Widget::y((Fl_Widget *)this);
    by = (iVar2 - iVar1) + -4;
    if (-1 < by) {
      by = by / 0xe;
    }
    if ((((bx < 0) || (7 < bx)) || (by < 0)) || (0x1f < by)) {
      Y = *(int *)&(this->super_Fl_Window).field_0xec;
    }
    else {
      Y = by * 8 + bx;
    }
    break;
  case 2:
    this->done = 1;
    return 1;
  default:
    return 0;
  case 8:
    iVar2 = Fl::event_key();
    if (iVar2 == 0xff0d) {
LAB_00256ae7:
      this->done = 1;
      return 1;
    }
    if (iVar2 == 0xff1b) {
      this->which = *(Fl_Color *)&(this->super_Fl_Window).field_0xec;
      this->done = 1;
      return 1;
    }
    if (iVar2 == 0xff51) {
      if (Y != 0) {
        Y = Y + -1;
      }
    }
    else if (iVar2 == 0xff52) {
      if (7 < (uint)Y) {
        Y = Y + -8;
      }
    }
    else if (iVar2 == 0xff53) {
      if ((uint)Y < 0xff) {
        Y = Y + 1;
      }
    }
    else {
      if (iVar2 != 0xff54) {
        if (iVar2 != 0xff8d) {
          return 0;
        }
        goto LAB_00256ae7;
      }
      if ((uint)Y < 0xf8) {
        Y = Y + 8;
      }
    }
  }
  if (Y != this->which) {
    this->which = Y;
    Fl_Widget::damage((Fl_Widget *)this,'\x01');
    px = (Y & 7U) * 0xe + 4;
    py = ((uint)Y >> 3) * 0xe + 4;
    scr_x = Fl_Widget::x((Fl_Widget *)this);
    scr_y = Fl_Widget::y((Fl_Widget *)this);
    Fl::screen_xywh(&scr_w,&scr_h,&local_44,&local_48);
    if (scr_x < scr_w) {
      scr_x = scr_w;
    }
    if (scr_w + local_44 <= scr_x + px + 0x12) {
      scr_x = ((scr_w + local_44) - px) + -0x12;
    }
    if (scr_y < scr_h) {
      scr_y = scr_h;
    }
    if (scr_h + local_48 <= scr_y + py + 0x12) {
      scr_y = ((scr_h + local_48) - py) + -0x12;
    }
    if (scr_x + px < 4) {
      scr_x = 4 - px;
    }
    if (scr_y + py < 4) {
      scr_y = 4 - py;
    }
    Fl_Widget::position((Fl_Widget *)this,scr_x,scr_y);
  }
  return 1;
}

Assistant:

int ColorMenu::handle(int e) {
  Fl_Color c = which;
  switch (e) {
  case FL_PUSH:
  case FL_DRAG: {
    int X = (Fl::event_x_root() - x() - BORDER);
    if (X >= 0) X = X/BOXSIZE;
    int Y = (Fl::event_y_root() - y() - BORDER);
    if (Y >= 0) Y = Y/BOXSIZE;
    if (X >= 0 && X < 8 && Y >= 0 && Y < 32)
      c = 8*Y + X;
    else
      c = initial;
    } break;
  case FL_RELEASE:
    done = 1;
    return 1;
  case FL_KEYBOARD:
    switch (Fl::event_key()) {
    case FL_Up: if (c > 7) c -= 8; break;
    case FL_Down: if (c < 256-8) c += 8; break;
    case FL_Left: if (c > 0) c--; break;
    case FL_Right: if (c < 255) c++; break;
    case FL_Escape: which = initial; done = 1; return 1;
    case FL_KP_Enter:
    case FL_Enter: done = 1; return 1;
    default: return 0;
    }
    break;
  default:
    return 0;
  }
  if (c != which) {
    which = (Fl_Color)c; damage(FL_DAMAGE_CHILD);
    int bx = (c%8)*BOXSIZE+BORDER;
    int by = (c/8)*BOXSIZE+BORDER;
    int px = x();
    int py = y();
    int scr_x, scr_y, scr_w, scr_h;
    Fl::screen_xywh(scr_x, scr_y, scr_w, scr_h);
    if (px < scr_x) px = scr_x;
    if (px+bx+BOXSIZE+BORDER >= scr_x+scr_w) px = scr_x+scr_w-bx-BOXSIZE-BORDER;
    if (py < scr_y) py = scr_y;
    if (py+by+BOXSIZE+BORDER >= scr_y+scr_h) py = scr_y+scr_h-by-BOXSIZE-BORDER;
    if (px+bx < BORDER) px = BORDER-bx;
    if (py+by < BORDER) py = BORDER-by;
    position(px,py);
  }
  return 1;
}